

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_ManMatrPrint(Sbd_Man_t *p,word *Cover,int nCol,int nRows)

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  uint local_2c;
  int local_28;
  uint local_24;
  int k;
  int i;
  int nRows_local;
  int nCol_local;
  word *Cover_local;
  Sbd_Man_t *p_local;
  
  for (local_24 = 0; (int)local_24 <= nCol; local_24 = local_24 + 1) {
    printf("%2d : ",(ulong)local_24);
    if (local_24 == nCol) {
      local_2c = Vec_IntEntry(p->vLutLevs,p->Pivot);
    }
    else {
      p_00 = p->vLutLevs;
      p_01 = p->vWinObjs;
      iVar1 = Vec_IntEntry(p->vDivVars,local_24);
      iVar1 = Vec_IntEntry(p_01,iVar1);
      local_2c = Vec_IntEntry(p_00,iVar1);
    }
    printf("%d ",(ulong)local_2c);
    for (local_28 = 0; local_28 < nRows; local_28 = local_28 + 1) {
      printf("%d",(ulong)((uint)(Cover[(int)local_24] >> ((byte)local_28 & 0x3f)) & 1));
    }
    printf("\n");
  }
  printf("\n");
  return;
}

Assistant:

void Sbd_ManMatrPrint( Sbd_Man_t * p, word Cover[], int nCol, int nRows )
{
    int i, k;
    for ( i = 0; i <= nCol; i++ )
    {
        printf( "%2d : ", i );
        printf( "%d ", i == nCol ? Vec_IntEntry(p->vLutLevs, p->Pivot) : Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Vec_IntEntry(p->vDivVars, i))) );
        for ( k = 0; k < nRows; k++ )
            printf( "%d", (int)((Cover[i] >> k) & 1) );
        printf( "\n"); 
    }
    printf( "\n");
}